

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cRobustnessTests.cpp
# Opt level: O0

IterateResult __thiscall
es32cts::ResetNotificationStrategy::LoseContextOnResetCase::iterate(LoseContextOnResetCase *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  int local_1b8 [4];
  MessageBuilder local_1a8;
  long local_28;
  Functions *gl;
  LoseContextOnResetCase *pLStack_18;
  GLint reset;
  LoseContextOnResetCase *this_local;
  
  pLStack_18 = this;
  RobustnessBase::createRobustContext
            (&this->super_RobustnessBase,RESET_NOTIFICATION_STRATEGY_LOSE_CONTEXT_ON_RESET);
  gl._4_4_ = 0;
  pRVar2 = RobustnessBase::getRobustContext(&this->super_RobustnessBase);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  local_28 = CONCAT44(extraout_var,iVar1);
  (**(code **)(local_28 + 0x868))(0x8256,(long)&gl + 4);
  err = (**(code **)(local_28 + 0x800))();
  glu::checkError(err,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles32/es32cRobustnessTests.cpp"
                  ,0x9b);
  if (gl._4_4_ == 0x8252) {
    tcu::TestContext::setTestResult
              ((this->super_RobustnessBase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
    RobustnessBase::releaseRobustContext(&this->super_RobustnessBase);
  }
  else {
    this_00 = tcu::TestContext::getLog
                        ((this->super_RobustnessBase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
    tcu::TestLog::operator<<(&local_1a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1a8,(char (*) [42])"Test failed! glGet returned wrong value [");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)((long)&gl + 4));
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])0x2c24a65);
    local_1b8[0] = 0x8252;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1b8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2af8aaf);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    tcu::TestContext::setTestResult
              ((this->super_RobustnessBase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
    RobustnessBase::releaseRobustContext(&this->super_RobustnessBase);
  }
  return STOP;
}

Assistant:

virtual IterateResult iterate(void)
	{
		createRobustContext(glu::RESET_NOTIFICATION_STRATEGY_LOSE_CONTEXT_ON_RESET);

		glw::GLint reset = 0;

		const glw::Functions& gl = getRobustContext()->getFunctions();
		gl.getIntegerv(GL_RESET_NOTIFICATION_STRATEGY, &reset);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv");

		if (reset != GL_LOSE_CONTEXT_ON_RESET)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Test failed! glGet returned wrong value [" << reset
							   << ", expected " << GL_LOSE_CONTEXT_ON_RESET << "]." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			releaseRobustContext();
			return STOP;
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		releaseRobustContext();
		return STOP;
	}